

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

ImRect ImGui::TableGetCellBgRect(ImGuiTable *table,int column_n)

{
  ImGuiTableColumn *pIVar1;
  float x1_00;
  float fVar2;
  float x2;
  float x1;
  ImGuiTableColumn *column;
  int column_n_local;
  ImGuiTable *table_local;
  
  pIVar1 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,column_n);
  fVar2 = pIVar1->MaxX;
  x1_00 = ImMax<float>(pIVar1->MinX,(table->WorkRect).Min.x);
  fVar2 = ImMin<float>(fVar2,(table->WorkRect).Max.x);
  ImRect::ImRect((ImRect *)&table_local,x1_00,table->RowPosY1,fVar2,table->RowPosY2);
  return _table_local;
}

Assistant:

ImRect ImGui::TableGetCellBgRect(const ImGuiTable* table, int column_n)
{
    const ImGuiTableColumn* column = &table->Columns[column_n];
    float x1 = column->MinX;
    float x2 = column->MaxX;
    //if (column->PrevEnabledColumn == -1)
    //    x1 -= table->OuterPaddingX;
    //if (column->NextEnabledColumn == -1)
    //    x2 += table->OuterPaddingX;
    x1 = ImMax(x1, table->WorkRect.Min.x);
    x2 = ImMin(x2, table->WorkRect.Max.x);
    return ImRect(x1, table->RowPosY1, x2, table->RowPosY2);
}